

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxRandom2::Emit(FxRandom2 *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  VMFunction *pVVar2;
  bool bVar3;
  uint uVar4;
  int opcode_00;
  FName local_34;
  int opcode;
  PSymbol *sym;
  VMFunction *callfunc;
  VMFunctionBuilder *build_local;
  FxRandom2 *this_local;
  ExpEmit out;
  
  callfunc = (VMFunction *)build;
  build_local = (VMFunctionBuilder *)this;
  FName::FName(&local_34,NAME_BuiltinRandom);
  _opcode = (DObject *)FindBuiltinFunction(&local_34,BuiltinRandom);
  bVar3 = DObject::IsKindOf(_opcode,PSymbolVMFunction::RegistrationInfo.MyClass);
  pVVar2 = callfunc;
  if (!bVar3) {
    __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1572,"virtual ExpEmit FxRandom2::Emit(VMFunctionBuilder *)");
  }
  if (_opcode[1]._vptr_DObject != (_func_int **)0x0) {
    sym = (PSymbol *)_opcode[1]._vptr_DObject;
    opcode_00 = 0x49;
    if ((this->EmitTail & 1U) != 0) {
      opcode_00 = 0x4c;
    }
    uVar4 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)callfunc,this->rng,'\x02');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)pVVar2,0x46,0,7,uVar4);
    EmitParameter((VMFunctionBuilder *)callfunc,this->mask,
                  &(this->super_FxExpression).ScriptPosition);
    pVVar2 = callfunc;
    uVar4 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)callfunc,sym,'\x01');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)pVVar2,opcode_00,uVar4,2,1);
    if ((this->EmitTail & 1U) == 0) {
      ExpEmit::ExpEmit((ExpEmit *)&this_local,(VMFunctionBuilder *)callfunc,0,1);
      VMFunctionBuilder::Emit((VMFunctionBuilder *)callfunc,0x4d,0,0,(uint)(ushort)this_local);
    }
    else {
      ExpEmit::ExpEmit((ExpEmit *)&this_local);
      this_local._6_1_ = 1;
    }
    EVar1.RegType = this_local._2_1_;
    EVar1.RegCount = this_local._3_1_;
    EVar1.Konst = (bool)this_local._4_1_;
    EVar1.Fixed = (bool)this_local._5_1_;
    EVar1.RegNum = (ushort)this_local;
    EVar1.Final = (bool)this_local._6_1_;
    EVar1.Target = (bool)this_local._7_1_;
    return EVar1;
  }
  __assert_fail("((PSymbolVMFunction *)sym)->Function != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x1573,"virtual ExpEmit FxRandom2::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxRandom2::Emit(VMFunctionBuilder *build)
{
	// Call the BuiltinRandom function to generate the random number.
	VMFunction *callfunc;
	PSymbol *sym = FindBuiltinFunction(NAME_BuiltinRandom, BuiltinRandom);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != nullptr);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	int opcode = (EmitTail ? OP_TAIL_K : OP_CALL_K);

	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(rng, ATAG_RNG));
	EmitParameter(build, mask, ScriptPosition);
	build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 2, 1);

	if (EmitTail)
	{
		ExpEmit call;
		call.Final = true;
		return call;
	}

	ExpEmit out(build, REGT_INT);
	build->Emit(OP_RESULT, 0, REGT_INT, out.RegNum);
	return out;
}